

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_directory.hpp
# Opt level: O2

void vfs::posix_directory::scan<vfs::directory_interface<vfs::posix_directory>>
               (path *dirPath,
               vector<vfs::directory_interface<vfs::posix_directory>,_std::allocator<vfs::directory_interface<vfs::posix_directory>_>_>
               *subDirectories,vector<vfs::path,_std::allocator<vfs::path>_> *files)

{
  char cVar1;
  DIR *__dirp;
  dirent *pdVar2;
  size_t sVar3;
  char (*in_RCX) [256];
  char *p0;
  string local_50 [32];
  
  __dirp = opendir((dirPath->pathStr_)._M_dataplus._M_p);
  if (__dirp != (DIR *)0x0) {
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      p0 = pdVar2->d_name;
      path::combine<char(&)[256]>((path *)local_50,dirPath,(path *)p0,in_RCX);
      if (pdVar2->d_type == '\x04') {
        sVar3 = strlen(p0);
        if (sVar3 == 2) {
          if (*p0 == '.') {
            cVar1 = pdVar2->d_name[1];
            goto joined_r0x0013112f;
          }
        }
        else if (sVar3 == 1) {
          cVar1 = *p0;
joined_r0x0013112f:
          if (cVar1 == '.') goto LAB_0013113d;
        }
        std::
        vector<vfs::directory_interface<vfs::posix_directory>,std::allocator<vfs::directory_interface<vfs::posix_directory>>>
        ::emplace_back<vfs::path_const>
                  ((vector<vfs::directory_interface<vfs::posix_directory>,std::allocator<vfs::directory_interface<vfs::posix_directory>>>
                    *)subDirectories,(path *)local_50);
      }
      else if (pdVar2->d_type == '\b') {
        std::vector<vfs::path,std::allocator<vfs::path>>::emplace_back<vfs::path_const>
                  ((vector<vfs::path,std::allocator<vfs::path>> *)files,(path *)local_50);
      }
LAB_0013113d:
      std::__cxx11::string::~string(local_50);
    }
    closedir(__dirp);
  }
  return;
}

Assistant:

static void scan(const path &dirPath, std::vector<_Dir> &subDirectories, std::vector<path> &files)
        {
            DIR *pDir = opendir(dirPath.c_str());
            if (pDir == nullptr)
            {
                return;
            }

            struct dirent *pEntry = nullptr;
            while ((pEntry = readdir(pDir)) != nullptr)
            {
                const auto &currentFilePath = path::combine(dirPath, pEntry->d_name);

                if (pEntry->d_type == DT_REG)
                {
                    files.emplace_back(std::move(currentFilePath));
                }
                else if (pEntry->d_type == DT_DIR)
                {
                    const auto nameLen = strlen(pEntry->d_name);
                    if (!((nameLen == 1 && pEntry->d_name[0] == '.') ||
                          (nameLen == 2 && strncmp(pEntry->d_name, "..", 2) == 0)))
                    {
                        subDirectories.emplace_back(std::move(currentFilePath));
                    }
                }
            }

            closedir(pDir);
        }